

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sproxy.cpp
# Opt level: O0

bool process_arguments(int argc,char **argv)

{
  int iVar1;
  long in_RSI;
  int in_EDI;
  int arg;
  int local_14;
  
  for (local_14 = 1; local_14 < in_EDI; local_14 = local_14 + 1) {
    iVar1 = strcmp("-c",*(char **)(in_RSI + (long)local_14 * 8));
    if ((iVar1 == 0) && (local_14 + 1 < in_EDI)) {
      local_14 = local_14 + 1;
      std::__cxx11::string::operator=
                ((string *)&config_filename_abi_cxx11_,*(char **)(in_RSI + (long)local_14 * 8));
    }
    else {
      iVar1 = strcmp("-D",*(char **)(in_RSI + (long)local_14 * 8));
      if (iVar1 == 0) {
        daemonize = true;
      }
      else {
        iVar1 = strcmp("-d",*(char **)(in_RSI + (long)local_14 * 8));
        if ((iVar1 == 0) && (local_14 + 1 < in_EDI)) {
          local_14 = local_14 + 1;
          std::__cxx11::string::operator=
                    ((string *)&default_filename_abi_cxx11_,*(char **)(in_RSI + (long)local_14 * 8))
          ;
        }
        else {
          iVar1 = strcmp("-i",*(char **)(in_RSI + (long)local_14 * 8));
          if ((iVar1 == 0) && (local_14 + 1 < in_EDI)) {
            local_14 = local_14 + 1;
            std::__cxx11::string::operator=
                      ((string *)&interface_name_abi_cxx11_,*(char **)(in_RSI + (long)local_14 * 8))
            ;
          }
          else {
            iVar1 = strcmp("-l",*(char **)(in_RSI + (long)local_14 * 8));
            if ((iVar1 == 0) && (local_14 + 1 < in_EDI)) {
              local_14 = local_14 + 1;
              std::__cxx11::string::operator=
                        ((string *)&interface_name_abi_cxx11_,
                         *(char **)(in_RSI + (long)local_14 * 8));
            }
            else {
              iVar1 = strcmp("--pidfile",*(char **)(in_RSI + (long)local_14 * 8));
              if ((iVar1 == 0) && (local_14 + 1 < in_EDI)) {
                local_14 = local_14 + 1;
                std::__cxx11::string::operator=
                          ((string *)&pid_filename_abi_cxx11_,
                           *(char **)(in_RSI + (long)local_14 * 8));
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool process_arguments(int argc, char** argv)
{
  // Loop over all the arguments, and process them
  for (int arg = 1; arg < argc; arg++)
  {
    // Argument -c specifies the config file filename
    if (strcmp("-c", argv[arg]) == 0 && arg + 1 < argc)
    {
      arg++;

      config_filename = argv[arg];
    }
    // Argument -D indicates this process should daemonize itself
    else if (strcmp("-D", argv[arg]) == 0)
    {
      daemonize = true;
    }
    // Argument -d specifies the default file filename
    else if (strcmp("-d", argv[arg]) == 0 && arg + 1 < argc)
    {
      arg++;

      default_filename = argv[arg];
    }
    // Argument -i specifies an interface to monitor
    else if (strcmp("-i", argv[arg]) == 0 && arg + 1 < argc)
    {
      arg++;

      interface_name = argv[arg];
    }
    // Argument -l specifies the log file filename
    else if (strcmp("-l", argv[arg]) == 0 && arg + 1 < argc)
    {
      arg++;

      interface_name = argv[arg];
    }
    else if (strcmp("--pidfile", argv[arg]) == 0 && arg + 1 < argc)
    {
      arg++;

      pid_filename = argv[arg];
    }

  }

  // If execution reaches here there was an acceptable set of arguments provided
  return true;
}